

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::interval_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
               (interval_t *idata,AggregateInputData *aggr_input_data,
               ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  interval_t *piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t *local_58;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar4 = 0;
      local_58 = idata;
      do {
        BaseModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
        Execute<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                  (states[iVar4],local_58,aggr_input_data);
        iVar4 = iVar4 + 1;
        local_58 = local_58 + 1;
      } while (count != iVar4);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar6 = count;
        }
LAB_00e8437b:
        uVar7 = uVar8;
        if (uVar8 < uVar6) {
          piVar5 = idata + uVar8;
          do {
            BaseModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
            Execute<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                      (states[uVar8],piVar5,aggr_input_data);
            uVar8 = uVar8 + 1;
            piVar5 = piVar5 + 1;
            uVar7 = uVar6;
          } while (uVar6 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[uVar3];
        uVar6 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar6 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00e8437b;
        uVar7 = uVar6;
        if ((uVar2 != 0) && (uVar7 = uVar8, uVar8 < uVar6)) {
          piVar5 = idata + uVar8;
          uVar9 = 0;
          do {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              BaseModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
              Execute<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                        (states[uVar8 + uVar9],piVar5,aggr_input_data);
            }
            uVar9 = uVar9 + 1;
            piVar5 = piVar5 + 1;
            uVar7 = uVar6;
          } while (uVar6 - uVar8 != uVar9);
        }
      }
      uVar3 = uVar3 + 1;
      uVar8 = uVar7;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}